

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

InstructionFolder * __thiscall spvtools::opt::IRContext::get_instruction_folder(IRContext *this)

{
  bool bVar1;
  type pIVar2;
  IRContext *local_20;
  unique_ptr<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_10 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->inst_folder_);
  if (!bVar1) {
    local_20 = this;
    MakeUnique<spvtools::opt::InstructionFolder,spvtools::opt::IRContext*>
              ((spvtools *)&local_18,&local_20);
    std::
    unique_ptr<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
    ::operator=(&this->inst_folder_,&local_18);
    std::
    unique_ptr<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
    ::~unique_ptr(&local_18);
  }
  pIVar2 = std::
           unique_ptr<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
           ::operator*(&this->inst_folder_);
  return pIVar2;
}

Assistant:

const InstructionFolder& get_instruction_folder() {
    if (!inst_folder_) {
      inst_folder_ = MakeUnique<InstructionFolder>(this);
    }
    return *inst_folder_;
  }